

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O2

void __thiscall Deque<int,_std::allocator<int>_>::~Deque(Deque<int,_std::allocator<int>_> *this)

{
  reset(this);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::~RingBuffer(&this->big_);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::~RingBuffer(&this->small_);
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::~RingBuffer(&this->current_);
  return;
}

Assistant:

~Deque() {
        reset();
    }